

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O0

REF_STATUS ref_adj_add_uniquely(REF_ADJ ref_adj,REF_INT node,REF_INT reference)

{
  REF_STATUS RVar1;
  REF_INT local_34;
  REF_INT local_30;
  int local_2c;
  REF_INT local_28;
  int local_24;
  REF_INT ref;
  REF_INT item;
  REF_INT reference_local;
  REF_INT node_local;
  REF_ADJ ref_adj_local;
  
  if ((node < 0) || (ref_adj->nnode <= node)) {
    local_2c = -1;
  }
  else {
    local_2c = ref_adj->first[node];
  }
  local_24 = local_2c;
  if (local_2c == -1) {
    local_30 = -1;
  }
  else {
    local_30 = ref_adj->item[local_2c].ref;
  }
  local_28 = local_30;
  while( true ) {
    if (local_24 == -1) {
      RVar1 = ref_adj_add(ref_adj,node,reference);
      return RVar1;
    }
    if (local_28 == reference) break;
    local_24 = ref_adj->item[local_24].next;
    if (local_24 == -1) {
      local_34 = -1;
    }
    else {
      local_34 = ref_adj->item[local_24].ref;
    }
    local_28 = local_34;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_add_uniquely(REF_ADJ ref_adj, REF_INT node,
                                        REF_INT reference) {
  REF_INT item, ref;

  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    if (ref == reference) {
      return REF_SUCCESS;
    }
  }

  return ref_adj_add(ref_adj, node, reference);
}